

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::BinaryAggregateHeap<duckdb::string_t,_int,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<duckdb::string_t,_int,_duckdb::LessThan> *this,
          ArenaAllocator *allocator,string_t *key,int *value)

{
  idx_t iVar1;
  bool bVar2;
  pair<duckdb::HeapEntry<duckdb::string_t>,_duckdb::HeapEntry<int>_> *__last;
  STORAGE_TYPE *__first;
  
  if (this->size < this->capacity) {
    HeapEntry<duckdb::string_t>::Assign(&this->heap[this->size].first,allocator,key);
    __first = this->heap;
    iVar1 = this->size;
    __last = __first + iVar1 + 1;
    __first[iVar1].second.value = *value;
    this->size = iVar1 + 1;
  }
  else {
    bVar2 = string_t::StringComparisonOperators::GreaterThan((string_t *)this->heap,key);
    if (!bVar2) {
      return;
    }
    ::std::
    pop_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<int>>*,bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<int>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<int>>const&)>
              (this->heap,this->heap + this->size,Compare);
    HeapEntry<duckdb::string_t>::Assign(&this->heap[this->size - 1].first,allocator,key);
    __first = this->heap;
    __last = __first + this->size;
    __first[this->size - 1].second.value = *value;
  }
  ::std::
  push_heap<std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<int>>*,bool(*)(std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<int>>const&,std::pair<duckdb::HeapEntry<duckdb::string_t>,duckdb::HeapEntry<int>>const&)>
            (__first,__last,Compare);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}